

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O3

int run_test_req_type_name(void)

{
  int iVar1;
  uv_handle_type uVar2;
  uv_fs_type uVar3;
  int extraout_EAX;
  char *pcVar4;
  size_t sVar5;
  uv_loop_t *puVar6;
  int *piVar7;
  uv_loop_t *puVar8;
  uv_fs_t *req;
  ssize_t sVar9;
  uv_stat_t *puVar10;
  uv_stat_t *puVar11;
  uv_loop_t *unaff_RBX;
  uv_pipe_t *unaff_R14;
  uv_os_fd_t uStack_4f4;
  sockaddr_in sStack_4f0;
  undefined1 auStack_4e0 [120];
  undefined1 auStack_468 [216];
  undefined1 auStack_390 [312];
  undefined1 auStack_258 [248];
  undefined1 auStack_160 [272];
  uv_pipe_t *puStack_50;
  uv_timeval64_t uStack_40;
  
  pcVar4 = uv_req_type_name(UV_REQ);
  iVar1 = strcmp(pcVar4,"req");
  if (iVar1 == 0) {
    pcVar4 = uv_req_type_name(UV_UDP_SEND);
    iVar1 = strcmp(pcVar4,"udp_send");
    if (iVar1 != 0) goto LAB_00159d67;
    pcVar4 = uv_req_type_name(UV_WORK);
    iVar1 = strcmp(pcVar4,"work");
    if (iVar1 != 0) goto LAB_00159d6c;
    pcVar4 = uv_req_type_name(UV_REQ_TYPE_MAX);
    if (pcVar4 != (char *)0x0) goto LAB_00159d71;
    pcVar4 = uv_req_type_name(UV_GETADDRINFO|UV_SHUTDOWN);
    if (pcVar4 != (char *)0x0) goto LAB_00159d76;
    pcVar4 = uv_req_type_name(UV_UNKNOWN_REQ);
    if (pcVar4 == (char *)0x0) {
      return 0;
    }
  }
  else {
    run_test_req_type_name_cold_1();
LAB_00159d67:
    run_test_req_type_name_cold_2();
LAB_00159d6c:
    run_test_req_type_name_cold_3();
LAB_00159d71:
    run_test_req_type_name_cold_4();
LAB_00159d76:
    run_test_req_type_name_cold_5();
  }
  run_test_req_type_name_cold_6();
  uStack_40._8_8_ = 0x159d8d;
  sVar5 = uv_loop_size();
  uStack_40._8_8_ = 0x159d95;
  puVar6 = (uv_loop_t *)malloc(sVar5);
  if (puVar6 == (uv_loop_t *)0x0) {
LAB_00159f89:
    puVar6 = unaff_RBX;
    uStack_40._8_8_ = 0x159f8e;
    run_test_getters_setters_cold_19();
LAB_00159f8e:
    uStack_40._8_8_ = 0x159f93;
    run_test_getters_setters_cold_1();
LAB_00159f93:
    uStack_40._8_8_ = 0x159f98;
    run_test_getters_setters_cold_2();
LAB_00159f98:
    uStack_40._8_8_ = 0x159f9d;
    run_test_getters_setters_cold_3();
LAB_00159f9d:
    uStack_40._8_8_ = 0x159fa2;
    run_test_getters_setters_cold_4();
LAB_00159fa2:
    uStack_40._8_8_ = 0x159fa7;
    run_test_getters_setters_cold_5();
LAB_00159fa7:
    uStack_40._8_8_ = 0x159fac;
    run_test_getters_setters_cold_6();
LAB_00159fac:
    uStack_40._8_8_ = 0x159fb1;
    run_test_getters_setters_cold_7();
LAB_00159fb1:
    uStack_40._8_8_ = 0x159fb6;
    run_test_getters_setters_cold_8();
LAB_00159fb6:
    uStack_40._8_8_ = 0x159fbb;
    run_test_getters_setters_cold_9();
LAB_00159fbb:
    uStack_40._8_8_ = 0x159fc0;
    run_test_getters_setters_cold_10();
LAB_00159fc0:
    uStack_40._8_8_ = 0x159fc5;
    run_test_getters_setters_cold_11();
LAB_00159fc5:
    uStack_40._8_8_ = 0x159fca;
    run_test_getters_setters_cold_12();
LAB_00159fca:
    uStack_40._8_8_ = 0x159fcf;
    run_test_getters_setters_cold_13();
LAB_00159fcf:
    uStack_40._8_8_ = 0x159fd4;
    run_test_getters_setters_cold_14();
LAB_00159fd4:
    uStack_40._8_8_ = 0x159fd9;
    run_test_getters_setters_cold_15();
LAB_00159fd9:
    uStack_40._8_8_ = 0x159fde;
    run_test_getters_setters_cold_18();
  }
  else {
    uStack_40._8_8_ = 0x159da9;
    iVar1 = uv_loop_init(puVar6);
    if (iVar1 != 0) goto LAB_00159f8e;
    uStack_40._8_8_ = 0x159dc3;
    uv_loop_set_data(puVar6,&cookie1);
    if ((int *)puVar6->data != &cookie1) goto LAB_00159f93;
    uStack_40._8_8_ = 0x159dd4;
    piVar7 = (int *)uv_loop_get_data(puVar6);
    if (piVar7 != &cookie1) goto LAB_00159f98;
    uStack_40._8_8_ = 0x159de7;
    sVar5 = uv_handle_size(UV_NAMED_PIPE);
    uStack_40._8_8_ = 0x159def;
    unaff_R14 = (uv_pipe_t *)malloc(sVar5);
    uStack_40._8_8_ = 0x159dff;
    uv_pipe_init(puVar6,unaff_R14,0);
    uStack_40._8_8_ = 0x159e07;
    uVar2 = uv_handle_get_type((uv_handle_t *)unaff_R14);
    if (uVar2 != UV_NAMED_PIPE) goto LAB_00159f9d;
    uStack_40._8_8_ = 0x159e18;
    puVar8 = uv_handle_get_loop((uv_handle_t *)unaff_R14);
    if (puVar8 != puVar6) goto LAB_00159fa2;
    unaff_R14->data = &cookie2;
    uStack_40._8_8_ = 0x159e33;
    piVar7 = (int *)uv_handle_get_data((uv_handle_t *)unaff_R14);
    if (piVar7 != &cookie2) goto LAB_00159fa7;
    uStack_40._8_8_ = 0x159e47;
    uv_handle_set_data((uv_handle_t *)unaff_R14,&cookie1);
    uStack_40._8_8_ = 0x159e4f;
    piVar7 = (int *)uv_handle_get_data((uv_handle_t *)unaff_R14);
    if (piVar7 != &cookie1) goto LAB_00159fac;
    if ((int *)unaff_R14->data != &cookie1) goto LAB_00159fb1;
    uStack_40._8_8_ = 0x159e69;
    sVar5 = uv_stream_get_write_queue_size((uv_stream_t *)unaff_R14);
    if (sVar5 != 0) goto LAB_00159fb6;
    unaff_R14->write_queue_size = unaff_R14->write_queue_size + 1;
    uStack_40._8_8_ = 0x159e7e;
    sVar5 = uv_stream_get_write_queue_size((uv_stream_t *)unaff_R14);
    if (sVar5 != 1) goto LAB_00159fbb;
    unaff_R14->write_queue_size = unaff_R14->write_queue_size - 1;
    uStack_40._8_8_ = 0x159e96;
    uv_close((uv_handle_t *)unaff_R14,(uv_close_cb)0x0);
    uStack_40._8_8_ = 0x159ea0;
    iVar1 = uv_run(puVar6,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00159fc0;
    uStack_40._8_8_ = 0x159eb2;
    sVar5 = uv_req_size(UV_FS);
    uStack_40._8_8_ = 0x159eba;
    req = (uv_fs_t *)malloc(sVar5);
    uStack_40._8_8_ = 0x159ed1;
    uv_fs_stat(puVar6,req,".",(uv_fs_cb)0x0);
    uStack_40._8_8_ = 0x159edb;
    iVar1 = uv_run(puVar6,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00159fc5;
    uStack_40._8_8_ = 0x159eeb;
    uVar3 = uv_fs_get_type(req);
    if (uVar3 != UV_FS_STAT) goto LAB_00159fca;
    uStack_40._8_8_ = 0x159efc;
    sVar9 = uv_fs_get_result(req);
    if (sVar9 != 0) goto LAB_00159fcf;
    uStack_40._8_8_ = 0x159f0d;
    puVar10 = (uv_stat_t *)uv_fs_get_ptr(req);
    uStack_40._8_8_ = 0x159f18;
    puVar11 = uv_fs_get_statbuf(req);
    if (puVar10 != puVar11) goto LAB_00159fd4;
    uStack_40._8_8_ = 0x159f29;
    puVar10 = uv_fs_get_statbuf(req);
    if ((puVar10->st_mode & 0x4000) == 0) goto LAB_00159fd9;
    uStack_40._8_8_ = 0x159f3b;
    pcVar4 = uv_fs_get_path(req);
    if ((*pcVar4 != '.') || (pcVar4[1] != '\0')) {
      uStack_40._8_8_ = 0x159f89;
      run_test_getters_setters_cold_16();
      unaff_RBX = puVar6;
      goto LAB_00159f89;
    }
    uStack_40._8_8_ = 0x159f4e;
    uv_fs_req_cleanup(req);
    uStack_40._8_8_ = 0x159f56;
    iVar1 = uv_loop_close(puVar6);
    if (iVar1 == 0) {
      uStack_40._8_8_ = 0x159f66;
      free(unaff_R14);
      uStack_40._8_8_ = 0x159f6e;
      free(req);
      uStack_40._8_8_ = 0x159f76;
      free(puVar6);
      return 0;
    }
  }
  uStack_40._8_8_ = 0x159fe3;
  run_test_getters_setters_cold_17();
  uStack_40.tv_sec = 0;
  puStack_50 = (uv_pipe_t *)0x159ff9;
  iVar1 = uv_gettimeofday(&uStack_40);
  if (iVar1 == 0) {
    if ((void *)uStack_40.tv_sec == (void *)0x0) goto LAB_0015a01d;
    puStack_50 = (uv_pipe_t *)0x15a00c;
    iVar1 = uv_gettimeofday((uv_timeval64_t *)0x0);
    if (iVar1 == -0x16) {
      return 0;
    }
  }
  else {
    puStack_50 = (uv_pipe_t *)0x15a01d;
    run_test_gettimeofday_cold_1();
LAB_0015a01d:
    puStack_50 = (uv_pipe_t *)0x15a022;
    run_test_gettimeofday_cold_3();
  }
  puStack_50 = (uv_pipe_t *)0x15a027;
  run_test_gettimeofday_cold_2();
  auStack_160._264_8_ = puVar6;
  puStack_50 = unaff_R14;
  puVar8 = uv_default_loop();
  puVar6 = (uv_loop_t *)0x1a4b3a;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_4f0);
  if (iVar1 == 0) {
    puVar6 = puVar8;
    iVar1 = uv_idle_init(puVar8,(uv_idle_t *)auStack_4e0);
    if (iVar1 != 0) goto LAB_0015a369;
    puVar6 = (uv_loop_t *)auStack_4e0;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -0x16) goto LAB_0015a36e;
    uv_close((uv_handle_t *)auStack_4e0,(uv_close_cb)0x0);
    puVar6 = puVar8;
    iVar1 = uv_tcp_init(puVar8,(uv_tcp_t *)auStack_258);
    if (iVar1 != 0) goto LAB_0015a373;
    puVar6 = (uv_loop_t *)auStack_258;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a378;
    puVar6 = (uv_loop_t *)auStack_258;
    iVar1 = uv_tcp_bind((uv_tcp_t *)puVar6,(sockaddr *)&sStack_4f0,0);
    if (iVar1 != 0) goto LAB_0015a37d;
    puVar6 = (uv_loop_t *)auStack_258;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != 0) goto LAB_0015a382;
    puVar6 = (uv_loop_t *)auStack_258;
    uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a387;
    puVar6 = puVar8;
    iVar1 = uv_udp_init(puVar8,(uv_udp_t *)auStack_468);
    if (iVar1 != 0) goto LAB_0015a38c;
    puVar6 = (uv_loop_t *)auStack_468;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a391;
    puVar6 = (uv_loop_t *)auStack_468;
    iVar1 = uv_udp_bind((uv_udp_t *)puVar6,(sockaddr *)&sStack_4f0,0);
    if (iVar1 != 0) goto LAB_0015a396;
    puVar6 = (uv_loop_t *)auStack_468;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != 0) goto LAB_0015a39b;
    puVar6 = (uv_loop_t *)auStack_468;
    uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a3a0;
    puVar6 = puVar8;
    iVar1 = uv_pipe_init(puVar8,(uv_pipe_t *)auStack_160,0);
    if (iVar1 != 0) goto LAB_0015a3a5;
    puVar6 = (uv_loop_t *)auStack_160;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a3aa;
    puVar6 = (uv_loop_t *)auStack_160;
    iVar1 = uv_pipe_bind((uv_pipe_t *)puVar6,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0015a3af;
    puVar6 = (uv_loop_t *)auStack_160;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != 0) goto LAB_0015a3b4;
    puVar6 = (uv_loop_t *)auStack_160;
    uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a3b9;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 < 0) {
      run_test_handle_fileno_cold_26();
LAB_0015a312:
      uv_run(puVar8,UV_RUN_DEFAULT);
      puVar6 = uv_default_loop();
      uv_walk(puVar6,close_walk_cb,(void *)0x0);
      uv_run(puVar6,UV_RUN_DEFAULT);
      puVar6 = uv_default_loop();
      iVar1 = uv_loop_close(puVar6);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015a3be;
    }
    puVar6 = puVar8;
    iVar1 = uv_tty_init(puVar8,(uv_tty_t *)auStack_390,iVar1,0);
    if (iVar1 != 0) goto LAB_0015a3c3;
    puVar6 = (uv_loop_t *)auStack_390;
    iVar1 = uv_is_readable((uv_stream_t *)puVar6);
    if (iVar1 == 0) goto LAB_0015a3c8;
    puVar6 = (uv_loop_t *)auStack_390;
    iVar1 = uv_is_writable((uv_stream_t *)puVar6);
    if (iVar1 != 0) goto LAB_0015a3cd;
    puVar6 = (uv_loop_t *)auStack_390;
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != 0) goto LAB_0015a3d2;
    puVar6 = (uv_loop_t *)auStack_390;
    uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar6,&uStack_4f4);
    if (iVar1 != -9) goto LAB_0015a3d7;
    puVar6 = (uv_loop_t *)auStack_390;
    iVar1 = uv_is_readable((uv_stream_t *)puVar6);
    if (iVar1 == 0) {
      puVar6 = (uv_loop_t *)auStack_390;
      iVar1 = uv_is_writable((uv_stream_t *)puVar6);
      if (iVar1 != 0) goto LAB_0015a3e1;
      goto LAB_0015a312;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0015a369:
    run_test_handle_fileno_cold_2();
LAB_0015a36e:
    run_test_handle_fileno_cold_3();
LAB_0015a373:
    run_test_handle_fileno_cold_4();
LAB_0015a378:
    run_test_handle_fileno_cold_5();
LAB_0015a37d:
    run_test_handle_fileno_cold_6();
LAB_0015a382:
    run_test_handle_fileno_cold_7();
LAB_0015a387:
    run_test_handle_fileno_cold_8();
LAB_0015a38c:
    run_test_handle_fileno_cold_9();
LAB_0015a391:
    run_test_handle_fileno_cold_10();
LAB_0015a396:
    run_test_handle_fileno_cold_11();
LAB_0015a39b:
    run_test_handle_fileno_cold_12();
LAB_0015a3a0:
    run_test_handle_fileno_cold_13();
LAB_0015a3a5:
    run_test_handle_fileno_cold_14();
LAB_0015a3aa:
    run_test_handle_fileno_cold_15();
LAB_0015a3af:
    run_test_handle_fileno_cold_16();
LAB_0015a3b4:
    run_test_handle_fileno_cold_17();
LAB_0015a3b9:
    run_test_handle_fileno_cold_18();
LAB_0015a3be:
    run_test_handle_fileno_cold_27();
LAB_0015a3c3:
    run_test_handle_fileno_cold_19();
LAB_0015a3c8:
    run_test_handle_fileno_cold_25();
LAB_0015a3cd:
    run_test_handle_fileno_cold_20();
LAB_0015a3d2:
    run_test_handle_fileno_cold_21();
LAB_0015a3d7:
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0015a3e1:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing((uv_handle_t *)puVar6);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(req_type_name) {
  ASSERT(strcmp(uv_req_type_name(UV_REQ), "req") == 0);
  ASSERT(strcmp(uv_req_type_name(UV_UDP_SEND), "udp_send") == 0);
  ASSERT(strcmp(uv_req_type_name(UV_WORK), "work") == 0);
  ASSERT(uv_req_type_name(UV_REQ_TYPE_MAX) == NULL);
  ASSERT(uv_req_type_name(UV_REQ_TYPE_MAX + 1) == NULL);
  ASSERT(uv_req_type_name(UV_UNKNOWN_REQ) == NULL);
  return 0;
}